

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stricmp(char *zLeft,char *zRight)

{
  char *zRight_local;
  char *zLeft_local;
  
  if (zLeft == (char *)0x0) {
    zLeft_local._4_4_ = 0;
    if (zRight != (char *)0x0) {
      zLeft_local._4_4_ = -1;
    }
  }
  else if (zRight == (char *)0x0) {
    zLeft_local._4_4_ = 1;
  }
  else {
    zLeft_local._4_4_ = sqlite3StrICmp(zLeft,zRight);
  }
  return zLeft_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  if( zLeft==0 ){
    return zRight ? -1 : 0;
  }else if( zRight==0 ){
    return 1;
  }
  return sqlite3StrICmp(zLeft, zRight);
}